

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode
JsDiagGetBreakOnException
          (JsRuntimeHandle runtimeHandle,JsDiagBreakOnExceptionAttributes *exceptionAttributes)

{
  code *pcVar1;
  bool bVar2;
  JsDiagBreakOnExceptionAttributes JVar3;
  JsrtDebugManager *this;
  undefined4 *puVar4;
  JsErrorCode JVar5;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else if (exceptionAttributes == (JsDiagBreakOnExceptionAttributes *)0x0) {
    JVar5 = JsErrorNullArgument;
  }
  else {
    *exceptionAttributes = JsDiagBreakOnExceptionAttributeNone;
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    this = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    JVar5 = JsErrorDiagNotInDebugMode;
    if (this != (JsrtDebugManager *)0x0) {
      bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this);
      if (bVar2) {
        JVar3 = JsrtDebugManager::GetBreakOnException(this);
        *exceptionAttributes = JVar3;
        JVar5 = JsNoError;
      }
    }
  }
  if ((JVar5 == JsErrorFatal) || (JVar5 == JsErrorNoCurrentContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar5;
}

Assistant:

CHAKRA_API JsDiagGetBreakOnException(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_ JsDiagBreakOnExceptionAttributes* exceptionAttributes)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(exceptionAttributes);

        *exceptionAttributes = JsDiagBreakOnExceptionAttributeNone;

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        *exceptionAttributes = jsrtDebugManager->GetBreakOnException();

        return JsNoError;
    });
#endif
}